

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.hpp
# Opt level: O2

NodeChildren * __thiscall
duckdb::Node256::ExtractChildren
          (NodeChildren *__return_storage_ptr__,Node256 *this,ArenaAllocator *arena)

{
  ushort uVar1;
  ushort uVar2;
  data_ptr_t pdVar3;
  Node *pNVar4;
  ulong index;
  idx_t i;
  long lVar5;
  ushort uVar6;
  
  pdVar3 = ArenaAllocator::AllocateAligned(arena,(ulong)this->count);
  uVar1 = this->count;
  array_ptr<unsigned_char,_true>::AssertNotNull(pdVar3 == (data_ptr_t)0x0);
  pNVar4 = (Node *)ArenaAllocator::AllocateAligned(arena,(ulong)this->count << 3);
  uVar2 = this->count;
  array_ptr<duckdb::Node,_true>::AssertNotNull(pNVar4 == (Node *)0x0);
  uVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    if (*(char *)((long)&this->children[lVar5].super_IndexPointer.data + 7) != '\0') {
      index = (ulong)uVar6;
      array_ptr<unsigned_char,_true>::AssertIndexInBounds(index,(ulong)uVar1);
      pdVar3[index] = (data_t)lVar5;
      array_ptr<duckdb::Node,_true>::AssertIndexInBounds(index,(ulong)uVar2);
      pNVar4[index].super_IndexPointer.data = this->children[lVar5].super_IndexPointer.data;
      uVar6 = uVar6 + 1;
    }
  }
  this->count = 0;
  (__return_storage_ptr__->bytes).ptr = pdVar3;
  (__return_storage_ptr__->bytes).count = (ulong)uVar1;
  (__return_storage_ptr__->children).ptr = pNVar4;
  (__return_storage_ptr__->children).count = (ulong)uVar2;
  return __return_storage_ptr__;
}

Assistant:

NodeChildren ExtractChildren(ArenaAllocator &arena) {
		auto mem_bytes = arena.AllocateAligned(sizeof(uint8_t) * count);
		array_ptr<uint8_t> bytes(mem_bytes, count);
		auto mem_children = arena.AllocateAligned(sizeof(Node) * count);
		array_ptr<Node> children_ptr(reinterpret_cast<Node *>(mem_children), count);

		uint16_t ptr_idx = 0;
		for (idx_t i = 0; i < CAPACITY; i++) {
			if (children[i].HasMetadata()) {
				bytes[ptr_idx] = UnsafeNumericCast<uint8_t>(i);
				children_ptr[ptr_idx] = children[i];
				ptr_idx++;
			}
		}

		count = 0;
		return NodeChildren(bytes, children_ptr);
	}